

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

void __thiscall LiteralsTable::print(LiteralsTable *this)

{
  Symbol *pSVar1;
  int i;
  long lVar2;
  
  puts(&DAT_0011664c);
  puts("-------------------------------------------");
  printf("LEXEMA\t\t");
  puts("\n-------------------------------------------");
  for (lVar2 = 0; lVar2 != 0x65; lVar2 = lVar2 + 1) {
    pSVar1 = (this->super_SymbolTable).block[lVar2];
    if (pSVar1 != (Symbol *)0x0) {
      for (; pSVar1 != (Symbol *)0x0; pSVar1 = pSVar1->nextSymbol) {
        printf("%s\t\t",(this->super_SymbolTable).lexemeArray + pSVar1->scope);
        putchar(10);
      }
    }
  }
  putchar(10);
  return;
}

Assistant:

void LiteralsTable::print() {
    printf("\nTABELA DE SÍMBOLOS: LITERAIS\n");
    printf("-------------------------------------------\n");

    //Check if column names headers needs to be printed
    //If necessary, print selected;
    printf("LEXEMA\t\t");

    printf("\n-------------------------------------------\n");

    for (int i = 0; i < TABLE_SIZE; ++i) { //Get all the entries

        Symbol *temp = block[i];
        if (temp == nullptr) //If its null, nothing to be done
        {
            continue;
        }

        while (temp != nullptr) {
            //Verify flags to print only requested columns
            printf("%s\t\t", this->lexemeArray + temp->getScope());

            printf("\n");
            temp = temp->getNextSymbol();
        }
    }
    printf("\n");
}